

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

void * background_thread_entry(void *ind_arg)

{
  pthread_t __target_thread;
  tsd_t *in_RDI;
  long *in_FS_OFFSET;
  uint thread_ind;
  tsd_t *tsd;
  tsd_t *tsd_1;
  int in_stack_00000054;
  undefined1 minimal;
  tsd_t *ptVar1;
  uint ind;
  tsd_t *in_stack_fffffffffffffff0;
  tsd_t *tsd_00;
  
  minimal = (undefined1)((ulong)in_RDI >> 0x18);
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"jemalloc_bg_thd");
  if (opt_percpu_arena != percpu_arena_disabled) {
    set_current_thread_affinity(in_stack_00000054);
  }
  ptVar1 = (tsd_t *)*in_FS_OFFSET;
  tsd_00 = ptVar1;
  if ((ptVar1->state).repr != '\0') {
    tsd_fetch_slow(in_RDI,(_Bool)minimal);
    tsd_00 = in_stack_fffffffffffffff0;
  }
  ind = (uint)((ulong)ptVar1 >> 0x20);
  tsd_state_set((tsd_t *)ind_arg,thread_ind._3_1_);
  background_work(tsd_00,ind);
  return (void *)0x0;
}

Assistant:

static void *
background_thread_entry(void *ind_arg) {
	unsigned thread_ind = (unsigned)(uintptr_t)ind_arg;
	assert(thread_ind < max_background_threads);
#ifdef JEMALLOC_HAVE_PTHREAD_SETNAME_NP
	pthread_setname_np(pthread_self(), "jemalloc_bg_thd");
#elif defined(__FreeBSD__)
	pthread_set_name_np(pthread_self(), "jemalloc_bg_thd");
#endif
	if (opt_percpu_arena != percpu_arena_disabled) {
		set_current_thread_affinity((int)thread_ind);
	}
	/*
	 * Start periodic background work.  We use internal tsd which avoids
	 * side effects, for example triggering new arena creation (which in
	 * turn triggers another background thread creation).
	 */
	background_work(tsd_internal_fetch(), thread_ind);
	assert(pthread_equal(pthread_self(),
	    background_thread_info[thread_ind].thread));

	return NULL;
}